

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O1

void __thiscall libcellml::XmlDoc::parse(XmlDoc *this,string *input)

{
  long lVar1;
  xmlDocPtr pxVar2;
  
  xmlInitParser();
  lVar1 = xmlNewParserCtxt();
  *(XmlDoc **)(lVar1 + 0x1a8) = this;
  xmlSetStructuredErrorFunc(lVar1,structuredErrorCallback);
  pxVar2 = (xmlDocPtr)xmlCtxtReadDoc(lVar1,(input->_M_dataplus)._M_p,"/",0,0);
  this->mPimpl->mXmlDocPtr = pxVar2;
  xmlFreeParserCtxt(lVar1);
  xmlSetStructuredErrorFunc(0,0);
  xmlCleanupParser();
  return;
}

Assistant:

void XmlDoc::parse(const std::string &input)
{
    xmlInitParser();
    xmlParserCtxtPtr context = xmlNewParserCtxt();
    context->_private = reinterpret_cast<void *>(this);
    xmlSetStructuredErrorFunc(context, structuredErrorCallback);
    mPimpl->mXmlDocPtr = xmlCtxtReadDoc(context, reinterpret_cast<const xmlChar *>(input.c_str()), "/", nullptr, 0);
    xmlFreeParserCtxt(context);
    xmlSetStructuredErrorFunc(nullptr, nullptr);
    xmlCleanupParser();
}